

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sectionstyle.cpp
# Opt level: O3

bool __thiscall ON_SectionStyle::Write(ON_SectionStyle *this,ON_BinaryArchive *file)

{
  element_type *peVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  ON_Color *pOVar5;
  ON_SectionStylePrivate *pOVar6;
  ON_SectionStylePrivate *pOVar7;
  ON_SectionStylePrivate *pOVar8;
  undefined8 local_28;
  
  local_28 = in_RAX;
  bVar2 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,1);
  if (!bVar2) {
    return false;
  }
  bVar2 = ON_BinaryArchive::WriteModelComponentAttributes(file,&this->super_ON_ModelComponent,0x78);
  if (bVar2) {
    pOVar6 = this->m_private;
    pOVar7 = pOVar6;
    if (pOVar6 == (ON_SectionStylePrivate *)0x0) {
      pOVar7 = &DefaultSectionStylePrivate;
    }
    pOVar8 = Unset.m_private;
    if (Unset.m_private == (ON_SectionStylePrivate *)0x0) {
      pOVar8 = &DefaultSectionStylePrivate;
    }
    if (pOVar7->m_background_fill_mode == pOVar8->m_background_fill_mode) {
LAB_005abf4b:
      if (pOVar6 == (ON_SectionStylePrivate *)0x0) {
        pOVar5 = &ON_Color::UnsetColor;
      }
      else {
        pOVar5 = &pOVar6->m_background_fill_color;
      }
      local_28 = CONCAT44(local_28._4_4_,pOVar5->field_0);
      bVar2 = ON_Color::IsSet((ON_Color *)&local_28);
      if (bVar2) {
LAB_005abfde:
        bVar2 = ON_BinaryArchive::WriteChar(file,'\x02');
        if (bVar2) {
          if (this->m_private == (ON_SectionStylePrivate *)0x0) {
            pOVar5 = &ON_Color::UnsetColor;
          }
          else {
            pOVar5 = &this->m_private->m_background_fill_color;
          }
          local_28 = CONCAT44(local_28._4_4_,pOVar5->field_0);
          bVar2 = ON_BinaryArchive::WriteColor(file,(ON_Color *)&local_28);
          if (bVar2) {
            if (this->m_private == (ON_SectionStylePrivate *)0x0) {
              pOVar5 = &ON_Color::UnsetColor;
            }
            else {
              pOVar5 = &this->m_private->m_background_fill_print_color;
            }
            local_28 = CONCAT44(local_28._4_4_,pOVar5->field_0);
            bVar2 = ON_BinaryArchive::WriteColor(file,(ON_Color *)&local_28);
            if (bVar2) goto LAB_005ac053;
          }
        }
      }
      else {
        if (this->m_private == (ON_SectionStylePrivate *)0x0) {
          pOVar5 = &ON_Color::UnsetColor;
        }
        else {
          pOVar5 = &this->m_private->m_background_fill_print_color;
        }
        local_28 = CONCAT44(pOVar5->field_0,local_28._0_4_);
        bVar2 = ON_Color::IsSet((ON_Color *)((long)&local_28 + 4));
        if (bVar2) goto LAB_005abfde;
LAB_005ac053:
        pOVar6 = this->m_private;
        pOVar7 = pOVar6;
        if (pOVar6 == (ON_SectionStylePrivate *)0x0) {
          pOVar7 = &DefaultSectionStylePrivate;
        }
        if (pOVar7->m_boundary_visible == false) {
          bVar2 = ON_BinaryArchive::WriteChar(file,'\x03');
          if (bVar2) {
            pOVar6 = this->m_private;
            if (pOVar6 == (ON_SectionStylePrivate *)0x0) {
              pOVar6 = &DefaultSectionStylePrivate;
            }
            bVar2 = ON_BinaryArchive::WriteBool(file,pOVar6->m_boundary_visible);
            if (bVar2) {
              pOVar6 = this->m_private;
              goto LAB_005ac06a;
            }
          }
        }
        else {
LAB_005ac06a:
          if (pOVar6 == (ON_SectionStylePrivate *)0x0) {
            pOVar5 = &ON_Color::UnsetColor;
          }
          else {
            pOVar5 = &pOVar6->m_boundary_color;
          }
          local_28 = CONCAT44(local_28._4_4_,pOVar5->field_0);
          bVar2 = ON_Color::IsSet((ON_Color *)&local_28);
          if (bVar2) {
LAB_005ac0f7:
            bVar2 = ON_BinaryArchive::WriteChar(file,'\x04');
            if (bVar2) {
              if (this->m_private == (ON_SectionStylePrivate *)0x0) {
                pOVar5 = &ON_Color::UnsetColor;
              }
              else {
                pOVar5 = &this->m_private->m_boundary_color;
              }
              local_28 = CONCAT44(local_28._4_4_,pOVar5->field_0);
              bVar2 = ON_BinaryArchive::WriteColor(file,(ON_Color *)&local_28);
              if (bVar2) {
                if (this->m_private == (ON_SectionStylePrivate *)0x0) {
                  pOVar5 = &ON_Color::UnsetColor;
                }
                else {
                  pOVar5 = &this->m_private->m_boundary_print_color;
                }
                local_28 = CONCAT44(local_28._4_4_,pOVar5->field_0);
                bVar2 = ON_BinaryArchive::WriteColor(file,(ON_Color *)&local_28);
                if (bVar2) goto LAB_005ac16c;
              }
            }
          }
          else {
            if (this->m_private == (ON_SectionStylePrivate *)0x0) {
              pOVar5 = &ON_Color::UnsetColor;
            }
            else {
              pOVar5 = &this->m_private->m_boundary_print_color;
            }
            local_28 = CONCAT44(pOVar5->field_0,local_28._0_4_);
            bVar2 = ON_Color::IsSet((ON_Color *)((long)&local_28 + 4));
            if (bVar2) goto LAB_005ac0f7;
LAB_005ac16c:
            pOVar6 = this->m_private;
            pOVar7 = pOVar6;
            if (pOVar6 == (ON_SectionStylePrivate *)0x0) {
              pOVar7 = &DefaultSectionStylePrivate;
            }
            if (2.220446049250313e-16 <
                ABS(pOVar7->m_boundary_width_scale -
                    DefaultSectionStylePrivate.m_boundary_width_scale)) {
              bVar2 = ON_BinaryArchive::WriteChar(file,'\x05');
              if (bVar2) {
                pOVar6 = this->m_private;
                if (pOVar6 == (ON_SectionStylePrivate *)0x0) {
                  pOVar6 = &DefaultSectionStylePrivate;
                }
                bVar2 = ON_BinaryArchive::WriteDouble(file,pOVar6->m_boundary_width_scale);
                if (bVar2) {
                  pOVar6 = this->m_private;
                  goto LAB_005ac1db;
                }
              }
            }
            else {
LAB_005ac1db:
              pOVar7 = pOVar6;
              if (pOVar6 == (ON_SectionStylePrivate *)0x0) {
                pOVar7 = &DefaultSectionStylePrivate;
              }
              if (pOVar7->m_fill_rule == DefaultSectionStylePrivate.m_fill_rule) {
LAB_005ac1f4:
                pOVar7 = pOVar6;
                if (pOVar6 == (ON_SectionStylePrivate *)0x0) {
                  pOVar7 = &DefaultSectionStylePrivate;
                }
                if (pOVar7->m_hatch_index == DefaultSectionStylePrivate.m_hatch_index) {
LAB_005ac20d:
                  pOVar7 = pOVar6;
                  if (pOVar6 == (ON_SectionStylePrivate *)0x0) {
                    pOVar7 = &DefaultSectionStylePrivate;
                  }
                  if (2.220446049250313e-16 < ABS(pOVar7->m_hatch_scale + -1.0)) {
                    bVar2 = ON_BinaryArchive::WriteChar(file,'\b');
                    if (bVar2) {
                      pOVar6 = this->m_private;
                      if (pOVar6 == (ON_SectionStylePrivate *)0x0) {
                        pOVar6 = &DefaultSectionStylePrivate;
                      }
                      bVar2 = ON_BinaryArchive::WriteDouble(file,pOVar6->m_hatch_scale);
                      if (bVar2) {
                        pOVar6 = this->m_private;
                        goto LAB_005ac275;
                      }
                    }
                  }
                  else {
LAB_005ac275:
                    pOVar7 = pOVar6;
                    if (pOVar6 == (ON_SectionStylePrivate *)0x0) {
                      pOVar7 = &DefaultSectionStylePrivate;
                    }
                    if ((pOVar7->m_hatch_rotation != 0.0) || (NAN(pOVar7->m_hatch_rotation))) {
                      bVar2 = ON_BinaryArchive::WriteChar(file,'\t');
                      if (bVar2) {
                        pOVar6 = &DefaultSectionStylePrivate;
                        if (this->m_private != (ON_SectionStylePrivate *)0x0) {
                          pOVar6 = this->m_private;
                        }
                        bVar2 = ON_BinaryArchive::WriteDouble(file,pOVar6->m_hatch_rotation);
                        if (bVar2) {
                          pOVar6 = this->m_private;
                          goto LAB_005ac2d0;
                        }
                      }
                    }
                    else {
LAB_005ac2d0:
                      if (pOVar6 == (ON_SectionStylePrivate *)0x0) {
                        pOVar5 = &ON_Color::UnsetColor;
                      }
                      else {
                        pOVar5 = &pOVar6->m_hatch_color;
                      }
                      local_28 = CONCAT44(local_28._4_4_,pOVar5->field_0);
                      bVar2 = ON_Color::IsSet((ON_Color *)&local_28);
                      if (bVar2) {
LAB_005ac3a9:
                        bVar2 = ON_BinaryArchive::WriteChar(file,'\n');
                        if (bVar2) {
                          if (this->m_private == (ON_SectionStylePrivate *)0x0) {
                            pOVar5 = &ON_Color::UnsetColor;
                          }
                          else {
                            pOVar5 = &this->m_private->m_hatch_color;
                          }
                          local_28 = CONCAT44(local_28._4_4_,pOVar5->field_0);
                          bVar2 = ON_BinaryArchive::WriteColor(file,(ON_Color *)&local_28);
                          if (bVar2) {
                            if (this->m_private == (ON_SectionStylePrivate *)0x0) {
                              pOVar5 = &ON_Color::UnsetColor;
                            }
                            else {
                              pOVar5 = &this->m_private->m_hatch_print_color;
                            }
                            local_28 = CONCAT44(local_28._4_4_,pOVar5->field_0);
                            bVar2 = ON_BinaryArchive::WriteColor(file,(ON_Color *)&local_28);
                            if (bVar2) goto LAB_005ac416;
                          }
                        }
                      }
                      else {
                        if (this->m_private == (ON_SectionStylePrivate *)0x0) {
                          pOVar5 = &ON_Color::UnsetColor;
                        }
                        else {
                          pOVar5 = &this->m_private->m_hatch_print_color;
                        }
                        local_28 = CONCAT44(pOVar5->field_0,local_28._0_4_);
                        bVar2 = ON_Color::IsSet((ON_Color *)((long)&local_28 + 4));
                        if (bVar2) goto LAB_005ac3a9;
LAB_005ac416:
                        if (((this->m_private == (ON_SectionStylePrivate *)0x0) ||
                            (peVar1 = (this->m_private->m_custom_linetype).
                                      super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr, peVar1 == (element_type *)0x0)) ||
                           ((bVar2 = ON_BinaryArchive::WriteChar(file,'\v'), bVar2 &&
                            (iVar4 = (*(peVar1->super_ON_ModelComponent).super_ON_Object.
                                       _vptr_ON_Object[10])(peVar1), (char)iVar4 != '\0')))) {
                          bVar2 = ON_BinaryArchive::WriteChar(file,'\0');
                          goto LAB_005ac45c;
                        }
                      }
                    }
                  }
                }
                else {
                  bVar2 = ON_BinaryArchive::WriteChar(file,'\a');
                  if (bVar2) {
                    pOVar6 = this->m_private;
                    if (pOVar6 == (ON_SectionStylePrivate *)0x0) {
                      pOVar6 = &DefaultSectionStylePrivate;
                    }
                    bVar2 = ON_BinaryArchive::WriteInt(file,pOVar6->m_hatch_index);
                    if (bVar2) {
                      pOVar6 = this->m_private;
                      goto LAB_005ac20d;
                    }
                  }
                }
              }
              else {
                bVar2 = ON_BinaryArchive::WriteChar(file,'\x06');
                if (bVar2) {
                  pOVar6 = this->m_private;
                  if (pOVar6 == (ON_SectionStylePrivate *)0x0) {
                    pOVar6 = &DefaultSectionStylePrivate;
                  }
                  bVar2 = ON_BinaryArchive::WriteChar(file,pOVar6->m_fill_rule);
                  if (bVar2) {
                    pOVar6 = this->m_private;
                    goto LAB_005ac1f4;
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      bVar2 = ON_BinaryArchive::WriteChar(file,'\x01');
      if (bVar2) {
        pOVar6 = this->m_private;
        if (pOVar6 == (ON_SectionStylePrivate *)0x0) {
          pOVar6 = &DefaultSectionStylePrivate;
        }
        bVar2 = ON_BinaryArchive::WriteChar(file,pOVar6->m_background_fill_mode);
        if (bVar2) {
          pOVar6 = this->m_private;
          goto LAB_005abf4b;
        }
      }
    }
  }
  bVar2 = false;
LAB_005ac45c:
  bVar3 = ON_BinaryArchive::EndWrite3dmChunk(file);
  return (bool)(bVar3 & bVar2);
}

Assistant:

bool ON_SectionStyle::Write( ON_BinaryArchive& file) const
{
  bool rc = false;
  {
    const int minor_version = 1;
    if (!file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK, 1, minor_version))
      return false;
    for (;;)
    {
      // chunk version 1.0 fields
      if (!file.WriteModelComponentAttributes(*this,ON_ModelComponent::Attributes::BinaryArchiveAttributes))
        break;

      // Only write non-default values in a similar fashion as ON_3dmObjectAttributes
      if (BackgroundFillMode() != ON_SectionStyle::Unset.BackgroundFillMode())
      {
        const unsigned char itemType = ON_SectionStyleTypeCodes::BackgroundFillMode; // 1
        if (!file.WriteChar(itemType))
          break;
        unsigned char mode = (unsigned char)BackgroundFillMode();
        if (!file.WriteChar(mode))
          break;
      }
      if (BackgroundFillColor(false).IsSet() || BackgroundFillColor(true).IsSet())
      {
        const unsigned char itemType = ON_SectionStyleTypeCodes::BackgroundFillColor; // 2
        if (!file.WriteChar(itemType))
          break;
        if (!file.WriteColor(BackgroundFillColor(false)))
          break;
        if (!file.WriteColor(BackgroundFillColor(true)))
          break;
      }
      if (BoundaryVisible() != true)
      {
        const unsigned char itemType = ON_SectionStyleTypeCodes::BoundaryVisible; // 3
        if (!file.WriteChar(itemType))
          break;
        if (!file.WriteBool(BoundaryVisible()))
          break;
      }
      if (BoundaryColor(false).IsSet() || BoundaryColor(true).IsSet())
      {
        const unsigned char itemType = ON_SectionStyleTypeCodes::BoundaryColor; // 4
        if (!file.WriteChar(itemType))
          break;
        if (!file.WriteColor(BoundaryColor(false)))
          break;
        if (!file.WriteColor(BoundaryColor(true)))
          break;
      }
      if (fabs(BoundaryWidthScale() - DefaultSectionStylePrivate.m_boundary_width_scale) > ON_EPSILON)
      {
        const unsigned char itemType = ON_SectionStyleTypeCodes::BoundaryWidthScale; // 5
        if (!file.WriteChar(itemType))
          break;
        if (!file.WriteDouble(BoundaryWidthScale()))
          break;
      }
      if (SectionFillRule() != DefaultSectionStylePrivate.m_fill_rule)
      {
        const unsigned char itemType = ON_SectionStyleTypeCodes::SectionFillRule; // 6
        if (!file.WriteChar(itemType))
          break;
        if (!file.WriteChar((unsigned char)SectionFillRule()))
          break;
      }
      if (HatchIndex() != DefaultSectionStylePrivate.m_hatch_index)
      {
        const unsigned char itemType = ON_SectionStyleTypeCodes::HatchIndex; // 7
        if (!file.WriteChar(itemType))
          break;
        if (!file.WriteInt(HatchIndex()))
          break;
      }
      if (fabs(HatchScale() - 1.0) > ON_EPSILON)
      {
        const unsigned char itemType = ON_SectionStyleTypeCodes::HatchScale; // 8
        if (!file.WriteChar(itemType))
          break;
        if (!file.WriteDouble(HatchScale()))
          break;
      }
      if (HatchRotation() != 0.0)
      {
        const unsigned char itemType = ON_SectionStyleTypeCodes::HatchRotation; // 9
        if (!file.WriteChar(itemType))
          break;
        if (!file.WriteDouble(HatchRotation()))
          break;
      }
      if (HatchColor(false).IsSet() || HatchColor(true).IsSet())
      {
        const unsigned char itemType = ON_SectionStyleTypeCodes::HatchColor; // 10
        if (!file.WriteChar(itemType))
          break;
        if (!file.WriteColor(HatchColor(false)))
          break;
        if (!file.WriteColor(HatchColor(true)))
          break;
      }

      // chunk version 1.1 fields
      const ON_Linetype* customLinetype = BoundaryLinetype();
      if (customLinetype != nullptr)
      {
        const unsigned char itemType = ON_SectionStyleTypeCodes::BoundaryLinetype; // 11
        if (!file.WriteChar(itemType))
          break;
        if (!customLinetype->Write(file))
          break;
      }

      // 0 indicates end of new linetype attributes
      const unsigned char attributes_end = 0;
      if (!file.WriteChar(attributes_end))
        break;

      rc = true;
      break;
    }
  }
  if (!file.EndWrite3dmChunk())
    rc = false;
  return rc;
}